

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

int CVmObjString::getp_splice(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  vm_obj_id_t obj;
  size_t sVar4;
  vm_val_t *pvVar5;
  CVmObject *this;
  uint *in_RCX;
  long in_RDX;
  vm_val_t *in_RSI;
  vm_val_t *in_RDI;
  int tail_byte_len;
  size_t tail_byte_idx;
  char *newp;
  CVmObjString *new_str;
  size_t del_byte_len;
  vm_val_t new_ins_str;
  char *ins;
  size_t ins_byte_len;
  size_t start_byte_idx;
  int charlen;
  utf8_ptr p;
  size_t len;
  int del_char_len;
  int start_idx;
  uint oargc;
  char ins_buf [128];
  CVmNativeCodeDesc *in_stack_fffffffffffffea8;
  utf8_ptr *in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  int iVar6;
  int in_stack_fffffffffffffec4;
  int iVar7;
  uint uVar8;
  undefined4 in_stack_fffffffffffffed4;
  vm_val_t *in_stack_fffffffffffffed8;
  char *local_120;
  vm_val_t local_108;
  char *local_f8;
  size_t local_f0;
  size_t local_e8;
  int local_dc;
  size_t local_d0;
  int local_c4;
  int local_c0;
  uint local_ac;
  utf8_ptr local_a8 [17];
  void *local_20;
  vm_val_t *local_18;
  vm_val_t *local_10;
  
  if (in_RCX == (uint *)0x0) {
    uVar8 = 0;
  }
  else {
    uVar8 = *in_RCX;
  }
  local_ac = uVar8;
  local_20 = (void *)in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if ((getp_splice(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getp_splice(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                   ::desc), iVar2 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_splice::desc,2,1);
    __cxa_guard_release(&getp_splice(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                     (uint *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  if (iVar2 == 0) {
    local_c0 = CVmBif::pop_int_val();
    local_c4 = CVmBif::pop_int_val();
    local_d0 = vmb_get_len((char *)0x38f67e);
    local_20 = (void *)((long)local_20 + 2);
    utf8_ptr::utf8_ptr(in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8);
    sVar4 = utf8_ptr::len(in_stack_fffffffffffffeb0,(size_t)in_stack_fffffffffffffea8);
    local_dc = (int)sVar4;
    iVar2 = local_dc;
    if (-1 < local_c0) {
      iVar2 = -1;
    }
    iVar3 = iVar2 + local_c0;
    if (iVar3 < 0) {
      iVar3 = in_stack_fffffffffffffec4;
      iVar7 = 0;
    }
    else {
      iVar7 = iVar3;
      if (local_dc < iVar3) {
        iVar3 = local_dc;
        iVar7 = local_dc;
      }
    }
    if (local_c4 < 0) {
      iVar6 = 0;
    }
    else {
      in_stack_fffffffffffffebc = local_c4;
      iVar6 = local_c4;
      if (local_dc - iVar7 < local_c4) {
        in_stack_fffffffffffffebc = local_dc - iVar7;
        iVar6 = local_dc - iVar7;
      }
    }
    local_c4 = iVar6;
    local_c0 = iVar7;
    local_e8 = utf8_ptr::bytelen(in_stack_fffffffffffffeb0,(size_t)in_stack_fffffffffffffea8);
    CVmStack::push(local_18);
    local_f0 = 0;
    local_f8 = (char *)0x0;
    vm_val_t::set_nil(&local_108);
    if ((2 < local_ac) && (pvVar5 = CVmStack::get(1), pvVar5->typ != VM_NIL)) {
      in_stack_fffffffffffffeb0 = local_a8;
      CVmStack::get(1);
      local_f8 = cvt_to_str(in_stack_fffffffffffffed8,
                            (char *)CONCAT44(in_stack_fffffffffffffed4,uVar8),CONCAT44(iVar2,iVar7),
                            (vm_val_t *)CONCAT44(iVar3,iVar6),in_stack_fffffffffffffebc,
                            in_stack_fffffffffffffeb8);
      local_f0 = vmb_get_len((char *)0x38f839);
      local_f8 = local_f8 + 2;
    }
    CVmStack::push(&local_108);
    if ((local_c4 == 0) && (local_f0 == 0)) {
      uVar1 = *(undefined4 *)&local_18->field_0x4;
      local_10->typ = local_18->typ;
      *(undefined4 *)&local_10->field_0x4 = uVar1;
      local_10->val = local_18->val;
    }
    else {
      sVar4 = utf8_ptr::s_bytelen((char *)in_stack_fffffffffffffeb0,
                                  (size_t)in_stack_fffffffffffffea8);
      obj = create((int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),(size_t)local_10);
      vm_val_t::set_obj(local_10,obj);
      this = vm_objp(0);
      local_120 = cons_get_buf((CVmObjString *)this);
      if (local_e8 != 0) {
        memcpy(local_120,local_20,local_e8);
        local_120 = local_120 + local_e8;
      }
      if (local_f0 != 0) {
        memcpy(local_120,local_f8,local_f0);
        local_120 = local_120 + local_f0;
      }
      iVar2 = (int)local_d0 - (int)(local_e8 + sVar4);
      if (0 < iVar2) {
        memcpy(local_120,(void *)((long)local_20 + local_e8 + sVar4),(long)iVar2);
      }
    }
    CVmStack::discard(local_ac);
  }
  return 1;
}

Assistant:

int CVmObjString::getp_splice(VMG_ vm_val_t *retval,
                              const vm_val_t *self_val,
                              const char *str, uint *argc)
{
    char ins_buf[128];

    /* check arguments */
    uint oargc = (argc != 0 ? *argc : 0);
    static CVmNativeCodeDesc desc(2, 1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* retrieve the starting index and deletion length */
    int start_idx = CVmBif::pop_int_val(vmg0_);
    int del_char_len = CVmBif::pop_int_val(vmg0_);

    /* get and skip our length */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;
    utf8_ptr p((char *)str);
    int charlen = p.len(len);

    /* adjust the index to 0-based, and figure end-of-string offsets */
    start_idx += (start_idx < 0 ? charlen : -1);

    /* make sure the starting index and deletion length are in bounds */
    start_idx = (start_idx < 0 ? 0 :
                 start_idx > (int)charlen ? charlen :
                 start_idx);
    del_char_len = (del_char_len < 0 ? 0 :
                    del_char_len > (int)(charlen - start_idx) ? charlen - start_idx :
                    del_char_len);

    /* get the starting byte index */
    size_t start_byte_idx = p.bytelen(start_idx);

    /* save 'self' as gc protection */
    G_stk->push(self_val);
    
    /* 
     *   If there's an insertion string, get it as a string.  Treat nil as an
     *   empty insertion.  
     */
    size_t ins_byte_len = 0;
    const char *ins = 0;
    vm_val_t new_ins_str;
    new_ins_str.set_nil();
    if (oargc >= 3 && G_stk->get(1)->typ != VM_NIL)
    {
        /* 
         *   Leave the insertion string on the stack for gc protection, and
         *   do an explicit conversion to string.  
         */
        ins = cvt_to_str(vmg_ &new_ins_str, ins_buf, sizeof(ins_buf),
                         G_stk->get(1), 10, 0);
        ins_byte_len = vmb_get_len(ins);
        ins += VMB_LEN;
    }

    /* push the new insertion string (if any) for gc protection */
    G_stk->push(&new_ins_str);

    /* check to see if we're making any changes */
    if (del_char_len != 0 || ins_byte_len != 0)
    {
        /* figure the byte length to be deleted */
        size_t del_byte_len = utf8_ptr::s_bytelen(str + start_byte_idx, del_char_len);

        /* allocate a new string at the proper length */
        retval->set_obj(create(vmg_ FALSE, len + ins_byte_len - del_byte_len));
        CVmObjString *new_str = (CVmObjString *)vm_objp(vmg_ retval->val.obj);
        char *newp = new_str->cons_get_buf();

        /* copy the part of our string up to the starting index */
        if (start_byte_idx > 0)
        {
            memcpy(newp, str, start_byte_idx);
            newp += start_byte_idx;
        }

        /* if we have an insertion string, copy it */
        if (ins_byte_len != 0)
        {
            memcpy(newp, ins, ins_byte_len);
            newp += ins_byte_len;
        }

        /* if there's anything after the deleted section, add it */
        size_t tail_byte_idx = start_byte_idx + del_byte_len;
        int tail_byte_len = len - tail_byte_idx;
        if (tail_byte_len > 0)
            memcpy(newp, str + tail_byte_idx, tail_byte_len);
    }
    else
    {
        /* we're making no changes - return the original string */
        *retval = *self_val;
    }

    /* 
     *   discard the remaining arguments and the gc protection (original
     *   argc, minus 2 arg pops, plus 2 gc protection pushes -> oargc) 
     */
    G_stk->discard(oargc); 

    /* handled */
    return TRUE;
}